

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_ip_name(sockaddr *src,char *dst,size_t size)

{
  ushort uVar1;
  int iVar2;
  uint af;
  long lStack_8;
  
  uVar1 = src->sa_family;
  af = (uint)uVar1;
  if (uVar1 == 2) {
    lStack_8 = 4;
  }
  else {
    if (uVar1 != 10) {
      return -0x61;
    }
    af = 10;
    lStack_8 = 8;
  }
  iVar2 = uv_inet_ntop(af,src->sa_data + lStack_8 + -2,dst,size);
  return iVar2;
}

Assistant:

int uv_ip_name(const struct sockaddr *src, char *dst, size_t size) {
  switch (src->sa_family) {
  case AF_INET:
    return uv_inet_ntop(AF_INET, &((struct sockaddr_in *)src)->sin_addr,
                        dst, size);
  case AF_INET6:
    return uv_inet_ntop(AF_INET6, &((struct sockaddr_in6 *)src)->sin6_addr,
                        dst, size);
  default:
    return UV_EAFNOSUPPORT;
  }
}